

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shader.cpp
# Opt level: O1

bool __thiscall CS248::Shader::setScalarParameter(Shader *this,string *paramName,int value)

{
  GLint GVar1;
  
  GVar1 = (*__glewGetUniformLocation)((this->programId_).id,(paramName->_M_dataplus)._M_p);
  if (-1 < GVar1) {
    (*__glewUniform1i)(GVar1,value);
  }
  return -1 < GVar1;
}

Assistant:

bool Shader::setScalarParameter(const std::string& paramName, int value) {

    bool success = true;
    int uniformLocation = glGetUniformLocation(programId_.id, paramName.c_str());

    if (uniformLocation >= 0)
        glUniform1i(uniformLocation, value);
    else
        success = false;

    return success;
}